

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

uint32_t get_literal_price(lzma_lzma1_encoder *coder,uint32_t pos,uint32_t prev_byte,
                          _Bool match_mode,uint32_t match_byte,uint32_t symbol)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t bit;
  uint32_t subcoder_index;
  uint32_t match_bit;
  uint32_t offset;
  uint32_t price;
  probability *subcoder;
  uint local_20;
  uint32_t symbol_local;
  uint32_t match_byte_local;
  _Bool match_mode_local;
  uint32_t prev_byte_local;
  uint32_t pos_local;
  lzma_lzma1_encoder *coder_local;
  
  uVar1 = coder->literal_pos_mask;
  uVar2 = coder->literal_context_bits;
  uVar3 = coder->literal_context_bits;
  match_bit = 0;
  if (match_mode) {
    subcoder_index = 0x100;
    subcoder._4_4_ = symbol + 0x100;
    local_20 = match_byte;
    do {
      uVar4 = rc_bit_price(coder->literal
                           [((pos & uVar1) << ((byte)uVar2 & 0x1f)) +
                            (prev_byte >> (8U - (char)uVar3 & 0x1f))]
                           [subcoder_index + (local_20 << 1 & subcoder_index) +
                            (subcoder._4_4_ >> 8)],subcoder._4_4_ >> 7 & 1);
      match_bit = uVar4 + match_bit;
      uVar5 = subcoder._4_4_ << 1;
      subcoder_index = ((local_20 ^ subcoder._4_4_) << 1 ^ 0xffffffff) & subcoder_index;
      subcoder._4_4_ = uVar5;
      local_20 = local_20 << 1;
    } while (uVar5 < 0x10000);
  }
  else {
    match_bit = rc_bittree_price(coder->literal
                                 [((pos & uVar1) << ((byte)uVar2 & 0x1f)) +
                                  (prev_byte >> (8U - (char)uVar3 & 0x1f))],8,symbol);
  }
  return match_bit;
}

Assistant:

static uint32_t
get_literal_price(const lzma_lzma1_encoder *const coder, const uint32_t pos,
		const uint32_t prev_byte, const bool match_mode,
		uint32_t match_byte, uint32_t symbol)
{
	const probability *const subcoder = literal_subcoder(coder->literal,
			coder->literal_context_bits, coder->literal_pos_mask,
			pos, prev_byte);

	uint32_t price = 0;

	if (!match_mode) {
		price = rc_bittree_price(subcoder, 8, symbol);
	} else {
		uint32_t offset = 0x100;
		symbol += UINT32_C(1) << 8;

		do {
			match_byte <<= 1;

			const uint32_t match_bit = match_byte & offset;
			const uint32_t subcoder_index
					= offset + match_bit + (symbol >> 8);
			const uint32_t bit = (symbol >> 7) & 1;
			price += rc_bit_price(subcoder[subcoder_index], bit);

			symbol <<= 1;
			offset &= ~(match_byte ^ symbol);

		} while (symbol < (UINT32_C(1) << 16));
	}

	return price;
}